

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O0

void __thiscall
gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::
async_read_some(AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *this,
               vector<char,_std::allocator<char>_> *data,size_t max_sz,
               function<void_(const_std::error_code_&,_unsigned_long)> *cb)

{
  function<void_(const_std::error_code_&,_unsigned_long)> *token;
  mutable_buffers_1 *in_RCX;
  long in_RDI;
  mutable_buffers_1 mVar1;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  token = (function<void_(const_std::error_code_&,_unsigned_long)> *)(in_RDI + 0x20);
  mVar1 = asio::buffer<char,std::allocator<char>>(in_stack_ffffffffffffffd0,(size_t)in_RCX);
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::
  async_read_some<asio::mutable_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>_&>
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)
             mVar1.super_mutable_buffer.data_,in_RCX,token);
  return;
}

Assistant:

void async_read_some(
        std::vector<char>& data,
        std::size_t max_sz,
        std::function<void(const std::error_code&, std::size_t)> cb)
    {
        socket_.async_read_some(asio::buffer(data, max_sz), cb);
    }